

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void reallymarkobject(global_State *g,GCObject *o)

{
  ushort uVar1;
  long lVar2;
  GCObject **pnext;
  RaviArray *is;
  TValue *io_1;
  TValue pvalue;
  RaviArray *slice;
  Udata *iu;
  TValue *io;
  TValue uvalue;
  GCObject *o_local;
  global_State *g_local;
  
  uvalue._8_8_ = o;
  do {
    switch(*(undefined1 *)(uvalue._8_8_ + 8)) {
    case 4:
    case 0x14:
      *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) & 0xe7 | 0x20;
      return;
    case 5:
    case 6:
    case 8:
    case 9:
    case 0x26:
      if ((*(byte *)(uvalue._8_8_ + 8) & 0xf) < 10) {
        pnext = getgclist((GCObject *)uvalue._8_8_);
        linkgclist_((GCObject *)uvalue._8_8_,pnext,&g->gray);
        return;
      }
      __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x19f,"void reallymarkobject(global_State *, GCObject *)");
    case 7:
      if (*(char *)(uvalue._8_8_ + 8) != '\a') {
        __assert_fail("(o)->tt == 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x183,"void reallymarkobject(global_State *, GCObject *)");
      }
      if (*(long *)(uvalue._8_8_ + 0x10) != 0) {
        if (*(char *)(uvalue._8_8_ + 8) != '\a') {
          __assert_fail("(o)->tt == 7",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x183,"void reallymarkobject(global_State *, GCObject *)");
        }
        if ((*(byte *)(*(long *)(uvalue._8_8_ + 0x10) + 9) & 0x18) != 0) {
          if (*(char *)(uvalue._8_8_ + 8) != '\a') {
            __assert_fail("(o)->tt == 7",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x183,"void reallymarkobject(global_State *, GCObject *)");
          }
          if (9 < (*(byte *)(*(long *)(uvalue._8_8_ + 0x10) + 8) & 0xf)) {
            __assert_fail("((((((void) sizeof (((o)->tt == 7) ? 1 : 0), __extension__ ({ if ((o)->tt == 7) ; else __assert_fail (\"(o)->tt == 7\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c\", 387, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((o))))->u)))->metatable)->tt) & 0x0F) < (9+1)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x183,"void reallymarkobject(global_State *, GCObject *)");
          }
          if (*(char *)(uvalue._8_8_ + 8) != '\a') {
            __assert_fail("(o)->tt == 7",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x183,"void reallymarkobject(global_State *, GCObject *)");
          }
          reallymarkobject(g,*(GCObject **)(uvalue._8_8_ + 0x10));
        }
      }
      *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) & 0xe7 | 0x20;
      if (*(char *)(uvalue._8_8_ + 8) != '\a') {
        __assert_fail("(o)->tt == 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x185,"void reallymarkobject(global_State *, GCObject *)");
      }
      lVar2 = *(long *)(uvalue._8_8_ + 0x20);
      uVar1 = *(ushort *)(uvalue._8_8_ + 10);
      if ((uVar1 & 0x8000) != 0) {
        if ((uVar1 & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x185,"void reallymarkobject(global_State *, GCObject *)");
        }
        if ((uVar1 & 0x7f) != (ushort)*(byte *)(lVar2 + 8)) {
LAB_0013f9b4:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x185,"void reallymarkobject(global_State *, GCObject *)");
        }
        if (g->mainthread != (lua_State *)0x0) {
          if ((uVar1 & 0x8000) == 0) {
            __assert_fail("(((io)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x185,"void reallymarkobject(global_State *, GCObject *)");
          }
          if ((*(byte *)(lVar2 + 9) & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_0013f9b4;
        }
      }
      if ((uVar1 & 0x8000) == 0) {
        return;
      }
      if ((uVar1 & 0x8000) == 0) {
        __assert_fail("(((&uvalue)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x186,"void reallymarkobject(global_State *, GCObject *)");
      }
      if ((*(byte *)(lVar2 + 9) & 0x18) == 0) {
        return;
      }
      uvalue._8_8_ = lVar2;
      if ((uVar1 & 0x8000) == 0) {
        __assert_fail("(((&uvalue)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x187,"void reallymarkobject(global_State *, GCObject *)");
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x1a2,"void reallymarkobject(global_State *, GCObject *)");
    case 0x15:
    case 0x25:
      if ((*(char *)(uvalue._8_8_ + 8) != '\x15') && (*(char *)(uvalue._8_8_ + 8) != '%')) {
        __assert_fail("((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,399,"void reallymarkobject(global_State *, GCObject *)");
      }
      if ((*(char *)(uvalue._8_8_ + 8) != '\x15') && (*(char *)(uvalue._8_8_ + 8) != '%')) {
        __assert_fail("((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,400,"void reallymarkobject(global_State *, GCObject *)");
      }
      if (*(long *)(uvalue._8_8_ + 0x38) != 0) {
        if ((*(char *)(uvalue._8_8_ + 8) != '\x15') && (*(char *)(uvalue._8_8_ + 8) != '%')) {
          __assert_fail("((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,400,"void reallymarkobject(global_State *, GCObject *)");
        }
        if ((*(byte *)(*(long *)(uvalue._8_8_ + 0x38) + 9) & 0x18) != 0) {
          if ((*(char *)(uvalue._8_8_ + 8) != '\x15') && (*(char *)(uvalue._8_8_ + 8) != '%')) {
            __assert_fail("((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,400,"void reallymarkobject(global_State *, GCObject *)");
          }
          if (9 < (*(byte *)(*(long *)(uvalue._8_8_ + 0x38) + 8) & 0xf)) {
            __assert_fail("((((((void) sizeof ((((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))) ? 1 : 0), __extension__ ({ if (((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))) ; else __assert_fail (\"((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c\", 400, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((o))))->arr)))->metatable)->tt) & 0x0F) < (9+1)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,400,"void reallymarkobject(global_State *, GCObject *)");
          }
          if ((*(char *)(uvalue._8_8_ + 8) != '\x15') && (*(char *)(uvalue._8_8_ + 8) != '%')) {
            __assert_fail("((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,400,"void reallymarkobject(global_State *, GCObject *)");
          }
          reallymarkobject(g,*(GCObject **)(uvalue._8_8_ + 0x38));
        }
      }
      *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) & 0xe7 | 0x20;
      if ((*(byte *)(uvalue._8_8_ + 10) & 1) == 0) {
        return;
      }
      if (*(long *)(uvalue._8_8_ + 0x18) == 0) {
        __assert_fail("slice->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x194,"void reallymarkobject(global_State *, GCObject *)");
      }
      if (9 < (*(byte *)(*(long *)(uvalue._8_8_ + 0x18) + 8) & 0xf)) {
        __assert_fail("(((is->parent)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x195,"void reallymarkobject(global_State *, GCObject *)");
      }
      lVar2 = *(long *)(uvalue._8_8_ + 0x18);
      if (((*(byte *)(*(long *)(uvalue._8_8_ + 0x18) + 8) & 0x7f) != *(byte *)(lVar2 + 8)) ||
         ((g->mainthread != (lua_State *)0x0 &&
          ((*(byte *)(lVar2 + 9) & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x195,"void reallymarkobject(global_State *, GCObject *)");
      }
      uvalue._8_8_ = lVar2;
      if ((*(byte *)(lVar2 + 9) & 0x18) == 0) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
 reentry:
  switch (o->tt) {
    case LUA_TSHRSTR:
    case LUA_TLNGSTR: {
      set2black(o);  /* nothing to visit */
      break;
    }
    case LUA_TUSERDATA: {
      TValue uvalue;
      markobjectN(g, gco2u(o)->metatable);  /* mark its metatable */
      set2black(o);
      getuservalue(g->mainthread, gco2u(o), &uvalue);
      if (valiswhite(&uvalue)) {
        o = gcvalue(&uvalue);
        goto reentry;
      }
      break;
    }
    /* arrays are treated like userdata. */
    case RAVI_TIARRAY:
    case RAVI_TFARRAY: {
      RaviArray *slice = gco2array(o);
      markobjectN(g, gco2array(o)->metatable);  /* mark its metatable */
      set2black(o);
      if (slice->flags & RAVI_ARRAY_SLICE) {
        TValue pvalue;
        lua_assert(slice->parent);
        getsliceunderlying(g->mainthread, slice, &pvalue);
        if (valiswhite(&pvalue)) {
          o = gcvalue(&pvalue);
          goto reentry;
        }
      }
      break;
    }
    case LUA_TLCL: case LUA_TCCL: case LUA_TTABLE: 
	case LUA_TTHREAD: case LUA_TPROTO: {
      linkobjgclist(o, g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}